

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O2

void __thiscall
Voxelizer::CmdVoxelize(Voxelizer *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  CommandBuffer *pCVar1;
  long lVar2;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  allocator_type local_99;
  uint32_t push_constants [1];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  _push_constants = (pointer)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_ptr = (element_type *)0x0;
  myvk::CommandBuffer::CmdBeginRenderPass
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_render_pass,&this->m_framebuffer,
             (vector<VkClearValue,_std::allocator<VkClearValue>_> *)push_constants,
             VK_SUBPASS_CONTENTS_INLINE);
  std::_Vector_base<VkClearValue,_std::allocator<VkClearValue>_>::~_Vector_base
            ((_Vector_base<VkClearValue,_std::allocator<VkClearValue>_> *)push_constants);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::GraphicsPipeline,void>
            ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)push_constants,
             &(this->m_pipeline).
              super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>);
  myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)push_constants);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)push_constants,
             &(this->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &(((this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>)
  ;
  __l._M_len = 2;
  __l._M_array = (iterator)push_constants;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(&local_60,__l,&local_99);
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::GraphicsPipeline,void>
            (local_70,&(this->m_pipeline).
                       super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            (pCVar1,&local_60,(Ptr<PipelineBase> *)local_70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector(&local_60);
  lVar2 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)push_constants + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  _push_constants = (pointer)((ulong)_push_constants & 0xffffffff00000000);
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x10,0,4,push_constants);
  Scene::CmdDraw((this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 command_buffer,&this->m_pipeline_layout,4);
  myvk::CommandBuffer::CmdEndRenderPass
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  return;
}

Assistant:

void Voxelizer::CmdVoxelize(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) const {
	command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffer, {});
	{
		command_buffer->CmdBindPipeline(m_pipeline);
		command_buffer->CmdBindDescriptorSets({m_descriptor_set, m_scene_ptr->GetDescriptorSet()}, m_pipeline, {});

		uint32_t push_constants[] = {0};
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t),
		                                 push_constants);
		m_scene_ptr->CmdDraw(command_buffer, m_pipeline_layout, sizeof(uint32_t));
	}
	command_buffer->CmdEndRenderPass();
}